

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfdcapi_address.cpp
# Opt level: O3

int CfdFreeAddressesMultisigHandle(void *handle,void *addr_multisig_keys_handle)

{
  string local_40;
  
  cfd::Initialize();
  local_40._M_dataplus._M_p = (pointer)&local_40.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_40,"MultisigAddr","");
  cfd::capi::FreeBuffer(addr_multisig_keys_handle,&local_40,0x1e50);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_40._M_dataplus._M_p != &local_40.field_2) {
    operator_delete(local_40._M_dataplus._M_p);
  }
  return 0;
}

Assistant:

int CfdFreeAddressesMultisigHandle(
    void* handle, void* addr_multisig_keys_handle) {
  try {
    cfd::Initialize();
    FreeBuffer(
        addr_multisig_keys_handle, kPrefixMultisigAddresses,
        sizeof(CfdCapiMultisigAddresses));
    return CfdErrorCode::kCfdSuccess;
  } catch (const CfdException& except) {
    return SetLastError(handle, except);
  } catch (const std::exception& std_except) {
    SetLastFatalError(handle, std_except.what());
    return CfdErrorCode::kCfdUnknownError;
  } catch (...) {
    SetLastFatalError(handle, "unknown error.");
    return CfdErrorCode::kCfdUnknownError;
  }
}